

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_append_entries.cxx
# Opt level: O0

void __thiscall nuraft::raft_server::append_entries_in_bg(raft_server *this)

{
  bool bVar1;
  int iVar2;
  pthread_t __target_thread;
  char *__name;
  element_type *peVar3;
  raft_server *in_RDI;
  string thread_name;
  undefined8 in_stack_ffffffffffffff48;
  undefined1 __i;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  element_type *in_stack_ffffffffffffff58;
  string local_80 [32];
  string local_60 [55];
  allocator local_29;
  string local_28 [40];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"nuraft_append",&local_29);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  __target_thread = pthread_self();
  __name = (char *)std::__cxx11::string::c_str();
  pthread_setname_np(__target_thread,__name);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&in_RDI->l_);
  if (bVar1) {
    peVar3 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1acc95);
    iVar2 = (*peVar3->_vptr_logger[7])();
    if (3 < iVar2) {
      in_stack_ffffffffffffff58 =
           std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1accc5);
      msg_if_given_abi_cxx11_((char *)local_60,"bg append_entries thread initiated");
      __name = (char *)0x4;
      (*in_stack_ffffffffffffff58->_vptr_logger[8])
                (in_stack_ffffffffffffff58,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                 ,"append_entries_in_bg",0x68,local_60);
      std::__cxx11::string::~string(local_60);
    }
  }
  do {
    EventAwaiter::wait(in_RDI->bg_append_ea_,__name);
    EventAwaiter::reset((EventAwaiter *)0x1acd92);
    bVar1 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_ffffffffffffff58);
    __i = (undefined1)((ulong)in_stack_ffffffffffffff48 >> 0x38);
    if (bVar1) break;
    append_entries_in_bg_exec(in_RDI);
    bVar1 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_ffffffffffffff58);
    __i = (undefined1)((ulong)in_stack_ffffffffffffff48 >> 0x38);
  } while (((bVar1 ^ 0xffU) & 1) != 0);
  std::atomic<bool>::operator=
            ((atomic<bool> *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),(bool)__i
            );
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&in_RDI->l_);
  if (bVar1) {
    peVar3 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1ace13);
    iVar2 = (*peVar3->_vptr_logger[7])();
    if (3 < iVar2) {
      peVar3 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1ace43);
      msg_if_given_abi_cxx11_((char *)local_80,"bg append_entries thread terminated");
      (*peVar3->_vptr_logger[8])
                (peVar3,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                 ,"append_entries_in_bg",0x71,local_80);
      std::__cxx11::string::~string(local_80);
    }
  }
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

void raft_server::append_entries_in_bg() {
    std::string thread_name = "nuraft_append";
#ifdef __linux__
    pthread_setname_np(pthread_self(), thread_name.c_str());
#elif __APPLE__
    pthread_setname_np(thread_name.c_str());
#endif

    p_in("bg append_entries thread initiated");
    do {
        bg_append_ea_->wait();
        bg_append_ea_->reset();
        if (stopping_) break;

        append_entries_in_bg_exec();
    } while (!stopping_);
    append_bg_stopped_ = true;
    p_in("bg append_entries thread terminated");
}